

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

Aig_Obj_t * Csw_ObjSweep(Csw_Man_t *p,Aig_Obj_t *pObj,int fTriv)

{
  char cVar1;
  int iVar2;
  int fCompl1;
  uint uWord;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_00;
  Csw_Cut_t *pCVar4;
  abctime aVar5;
  uint *pTruth_00;
  abctime aVar6;
  Aig_Obj_t *local_b8;
  abctime clk;
  int iVar;
  int nFanins;
  int nVars;
  int k;
  int i;
  uint *pTruth;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Csw_Cut_t *pCutSet;
  Csw_Cut_t *pCut;
  Csw_Cut_t *pCut1;
  Csw_Cut_t *pCut0;
  int fUseResub;
  int fTriv_local;
  Aig_Obj_t *pObj_local;
  Csw_Man_t *p_local;
  
  pAVar3 = Aig_ObjFanin0(pObj);
  pObj_00 = Aig_ObjFanin1(pObj);
  iVar2 = Aig_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x1f7,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
  }
  iVar2 = Aig_ObjIsNode(pObj);
  if ((iVar2 != 0) && (pCVar4 = Csw_ObjCuts(p,pObj), pCVar4 == (Csw_Cut_t *)0x0)) {
    pCVar4 = Csw_ObjCuts(p,pObj);
    if (pCVar4 != (Csw_Cut_t *)0x0) {
      __assert_fail("Csw_ObjCuts(p, pObj) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                    ,0x1fd,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
    }
    iVar2 = Aig_ObjIsNode(pObj);
    if (iVar2 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                    ,0x1fe,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
    }
    Csw_ObjPrepareCuts(p,pObj,fTriv);
    nVars = 0;
    pCut1 = Csw_ObjCuts(p,pAVar3);
    while (nVars < p->nCutsMax) {
      if ('\0' < pCut1->nFanins) {
        nFanins = 0;
        pCut = Csw_ObjCuts(p,pObj_00);
        while (nFanins < p->nCutsMax) {
          if (('\0' < pCut->nFanins) &&
             (iVar2 = Kit_WordCountOnes(pCut1->uSign | pCut->uSign), iVar2 <= p->nLeafMax)) {
            pCVar4 = Csw_CutFindFree(p,pObj);
            aVar5 = Abc_Clock();
            iVar2 = Csw_CutMerge(p,pCut1,pCut,pCVar4);
            if (iVar2 == 0) {
              if (pCVar4->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                              ,0x212,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar2 = Csw_CutFilter(p,pObj,pCVar4);
              if (iVar2 == 0) {
                iVar2 = Aig_ObjFaninC0(pObj);
                fCompl1 = Aig_ObjFaninC1(pObj);
                pTruth_00 = Csw_CutComputeTruth(p,pCVar4,pCut1,pCut,iVar2,fCompl1);
                cVar1 = pCVar4->nFanins;
                iVar2 = Kit_TruthSupportSize(pTruth_00,p->nLeafMax);
                aVar6 = Abc_Clock();
                p->timeCuts = (aVar6 - aVar5) + p->timeCuts;
                if (iVar2 == 0) {
                  p->nNodesTriv0 = p->nNodesTriv0 + 1;
                  pAVar3 = Aig_ManConst1(p->pManRes);
                  pAVar3 = Aig_NotCond(pAVar3,(uint)(((*pTruth_00 & 1) != 0 ^ 0xffU) & 1));
                  return pAVar3;
                }
                if (iVar2 == 1) {
                  p->nNodesTriv1 = p->nNodesTriv1 + 1;
                  uWord = Kit_TruthSupport(pTruth_00,p->nLeafMax);
                  iVar2 = Kit_WordFindFirstBit(uWord);
                  if (iVar2 < pCVar4->nFanins) {
                    pAVar3 = Aig_ManObj(p->pManRes,
                                        *(int *)((long)&pCVar4[1].pNext + (long)iVar2 * 4));
                    pAVar3 = Aig_NotCond(pAVar3,*pTruth_00 & 1);
                    return pAVar3;
                  }
                  __assert_fail("iVar < pCut->nFanins",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x22d,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
                if (((iVar2 == 2) && ('\x02' < cVar1)) &&
                   (pAVar3 = Csw_ObjTwoVarCut(p,pCVar4), pAVar3 != (Aig_Obj_t *)0x0)) {
                  p->nNodesTriv2 = p->nNodesTriv2 + 1;
                  return pAVar3;
                }
                aVar5 = Abc_Clock();
                if (pCVar4->nFanins < '\x03') {
                  local_b8 = (Aig_Obj_t *)0x0;
                }
                else {
                  local_b8 = Csw_TableCutLookup(p,pCVar4);
                }
                aVar6 = Abc_Clock();
                p->timeHash = (aVar6 - aVar5) + p->timeHash;
                if (local_b8 != (Aig_Obj_t *)0x0) {
                  p->nNodesCuts = p->nNodesCuts + 1;
                  return local_b8;
                }
                iVar2 = Csw_CutFindCost(p,pCVar4);
                pCVar4->Cost = iVar2;
                if (pCVar4->nFanins < '\x01') {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x245,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
                if (pCVar4->Cost < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x246,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
              }
              else if (pCVar4->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                              ,0x218,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
              }
            }
          }
          nFanins = nFanins + 1;
          pCut = Csw_CutNext(pCut);
        }
      }
      nVars = nVars + 1;
      pCut1 = Csw_CutNext(pCut1);
    }
    p->nNodesTried = p->nNodesTried + 1;
    aVar5 = Abc_Clock();
    nVars = 0;
    pCutSet = Csw_ObjCuts(p,pObj);
    while (nVars < p->nCutsMax) {
      if ('\x02' < pCutSet->nFanins) {
        if (pCutSet->Cost < 1) {
          __assert_fail("pCut->Cost > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                        ,0x250,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
        }
        Csw_TableCutInsert(p,pCutSet);
      }
      nVars = nVars + 1;
      pCutSet = Csw_CutNext(pCutSet);
    }
    aVar6 = Abc_Clock();
    p->timeHash = (aVar6 - aVar5) + p->timeHash;
  }
  return pObj;
}

Assistant:

Aig_Obj_t * Csw_ObjSweep( Csw_Man_t * p, Aig_Obj_t * pObj, int fTriv )
{
    int fUseResub = 1;
    Csw_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    Aig_Obj_t * pObjNew;
    unsigned * pTruth;
    int i, k, nVars, nFanins, iVar;
    abctime clk;

    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) )
        return pObj;
    if ( Csw_ObjCuts(p, pObj) )
        return pObj;
    // the node is not processed yet
    assert( Csw_ObjCuts(p, pObj) == NULL );
    assert( Aig_ObjIsNode(pObj) );

    // set up the first cut
    pCutSet = Csw_ObjPrepareCuts( p, pObj, fTriv );

    // compute pair-wise cut combinations while checking table
    Csw_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Csw_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Csw_CutFindFree( p, pObj );
clk = Abc_Clock();
        // assemble the new cut
        if ( !Csw_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Csw_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        pTruth = Csw_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // support minimize the truth table
        nFanins = pCut->nFanins;
//        nVars = Csw_CutSupportMinimize( p, pCut ); // leads to quality degradation
        nVars = Kit_TruthSupportSize( pTruth, p->nLeafMax );
p->timeCuts += Abc_Clock() - clk;

        // check for trivial truth tables
        if ( nVars == 0 )
        {
            p->nNodesTriv0++;
            return Aig_NotCond( Aig_ManConst1(p->pManRes), !(pTruth[0] & 1) );
        }
        if ( nVars == 1 )
        {
            p->nNodesTriv1++;
            iVar = Kit_WordFindFirstBit( Kit_TruthSupport(pTruth, p->nLeafMax) );
            assert( iVar < pCut->nFanins );
            return Aig_NotCond( Aig_ManObj(p->pManRes, pCut->pFanins[iVar]), (pTruth[0] & 1) );
        }
        if ( nVars == 2 && nFanins > 2 && fUseResub )
        {
            if ( (pObjNew = Csw_ObjTwoVarCut( p, pCut )) )
            {
                p->nNodesTriv2++;
                return pObjNew;
            }
        }

        // check if an equivalent node with the same cut exists
clk = Abc_Clock();
        pObjNew = pCut->nFanins > 2 ? Csw_TableCutLookup( p, pCut ) : NULL;
p->timeHash += Abc_Clock() - clk;
        if ( pObjNew )
        {
            p->nNodesCuts++;
            return pObjNew;
        }

        // assign the cost
        pCut->Cost = Csw_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
    p->nNodesTried++;

    // load the resulting cuts into the table
clk = Abc_Clock();
    Csw_ObjForEachCut( p, pObj, pCut, i )
    {
        if ( pCut->nFanins > 2 )
        {
            assert( pCut->Cost > 0 );
            Csw_TableCutInsert( p, pCut );
        }
    }
p->timeHash += Abc_Clock() - clk;

    // return the node if could not replace it
    return pObj;
}